

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_function_utils.h
# Opt level: O0

void lf::mesh::utils::test::
     checkMeshFunctionEqual<lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpTranspose,lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::__5>>,lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::meshFunctionUnary_transpose_Test::TestBody()::__1>>
               (Mesh *m,MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpTranspose,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_unary_tests_cc:69:24)>_>
                        *a,
               MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_unary_tests_cc:145:7)>
               *b,int codim)

{
  Entity *e_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  reference ppEVar3;
  MatrixXd *pMVar4;
  ulong uVar5;
  size_type sVar6;
  PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *pPVar7;
  char *pcVar8;
  long lVar9;
  Index IVar10;
  DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *pDVar11;
  AssertHelper local_180;
  Message local_178;
  double local_170;
  double local_168;
  undefined1 local_160 [8];
  AssertionResult gtest_ar_2;
  int c;
  int r;
  Message local_140;
  Index local_138;
  Index local_130;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_110;
  Message local_108;
  Index local_100;
  Index local_f8;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar;
  undefined1 local_d8 [4];
  int i;
  vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  vals2;
  undefined1 local_b0 [8];
  vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  vals1;
  undefined1 local_90 [8];
  QuadRule qr;
  RefEl ref_el;
  Entity *e;
  iterator __end5;
  iterator __begin5;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range5;
  int codim_local;
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_unary_tests_cc:145:7)>
  *b_local;
  MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpTranspose,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_unary_tests_cc:69:24)>_>
  *a_local;
  Mesh *m_local;
  
  iVar2 = (*m->_vptr_Mesh[2])(m,(ulong)(uint)codim);
  __begin5._M_current = (Entity **)CONCAT44(extraout_var,iVar2);
  __end5 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                     ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin5);
  e = (Entity *)
      std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin5);
  do {
    bVar1 = __gnu_cxx::
            operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                      (&__end5,(__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                *)&e);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return;
    }
    ppEVar3 = __gnu_cxx::
              __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
              ::operator*(&__end5);
    e_00 = *ppEVar3;
    iVar2 = (*e_00->_vptr_Entity[4])();
    vals1.
    super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = (RefElType)iVar2;
    qr.weights_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows.
    _7_1_ = vals1.
            super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_;
    quad::make_QuadRule((QuadRule *)local_90,
                        vals1.
                        super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_,5);
    pMVar4 = quad::QuadRule::Points((QuadRule *)local_90);
    MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpTranspose,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_unary_tests.cc:69:24)>_>
    ::operator()((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                  *)local_b0,a,e_00,pMVar4);
    pMVar4 = quad::QuadRule::Points((QuadRule *)local_90);
    MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_unary_tests.cc:145:7)>
    ::operator()((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                  *)local_d8,b,e_00,pMVar4);
    for (gtest_ar.message_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl._4_4_ = 0;
        uVar5 = (ulong)gtest_ar.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl._4_4_,
        sVar6 = std::
                vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                ::size((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                        *)local_b0), uVar5 < sVar6;
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ =
             gtest_ar.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl._4_4_ + 1) {
      pPVar7 = &std::
                vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                ::operator[]((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                              *)local_b0,
                             (long)gtest_ar.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl._4_4_)->
                super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>;
      local_f8 = Eigen::PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::rows(pPVar7);
      pPVar7 = &std::
                vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                ::operator[]((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                              *)local_d8,
                             (long)gtest_ar.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl._4_4_)->
                super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>;
      local_100 = Eigen::PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::rows(pPVar7);
      testing::internal::EqHelper::Compare<long,_long,_nullptr>
                ((EqHelper *)local_f0,"vals1[i].rows()","vals2[i].rows()",&local_f8,&local_100);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
      if (!bVar1) {
        testing::Message::Message(&local_108);
        pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
        testing::internal::AssertHelper::AssertHelper
                  (&local_110,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_utils.h"
                   ,0x27,pcVar8);
        testing::internal::AssertHelper::operator=(&local_110,&local_108);
        testing::internal::AssertHelper::~AssertHelper(&local_110);
        testing::Message::~Message(&local_108);
      }
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
      if (gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ != 0) goto LAB_001be970;
      pPVar7 = &std::
                vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                ::operator[]((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                              *)local_b0,
                             (long)gtest_ar.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl._4_4_)->
                super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>;
      local_130 = Eigen::PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::cols(pPVar7);
      pPVar7 = &std::
                vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                ::operator[]((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                              *)local_d8,
                             (long)gtest_ar.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl._4_4_)->
                super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>;
      local_138 = Eigen::PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::cols(pPVar7);
      testing::internal::EqHelper::Compare<long,_long,_nullptr>
                ((EqHelper *)local_128,"vals1[i].cols()","vals2[i].cols()",&local_130,&local_138);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
      if (!bVar1) {
        testing::Message::Message(&local_140);
        pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&c,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_utils.h"
                   ,0x28,pcVar8);
        testing::internal::AssertHelper::operator=((AssertHelper *)&c,&local_140);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&c);
        testing::Message::~Message(&local_140);
      }
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
      if (gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ != 0) goto LAB_001be970;
      gtest_ar_2.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ = 0;
      while( true ) {
        lVar9 = (long)gtest_ar_2.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_4_;
        pPVar7 = &std::
                  vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                  ::operator[]((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                                *)local_b0,
                               (long)gtest_ar.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_)->
                  super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>;
        IVar10 = Eigen::PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::rows(pPVar7);
        if (IVar10 <= lVar9) break;
        gtest_ar_2.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_4_ = 0;
        while( true ) {
          lVar9 = (long)(int)gtest_ar_2.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
          pPVar7 = &std::
                    vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                    ::operator[]((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                                  *)local_b0,
                                 (long)gtest_ar.message_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._4_4_)->
                    super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>;
          IVar10 = Eigen::PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::cols(pPVar7);
          if (IVar10 <= lVar9) break;
          pDVar11 = (DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                    std::
                    vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                    ::operator[]((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                                  *)local_b0,
                                 (long)gtest_ar.message_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._4_4_);
          Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator()
                    (pDVar11,(long)gtest_ar_2.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl._4_4_,
                     (long)(int)gtest_ar_2.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl);
          pDVar11 = (DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                    std::
                    vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                    ::operator[]((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                                  *)local_d8,
                                 (long)gtest_ar.message_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._4_4_);
          Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator()
                    (pDVar11,(long)gtest_ar_2.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl._4_4_,
                     (long)(int)gtest_ar_2.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl);
          std::abs((int)pDVar11);
          local_170 = 1e-10;
          testing::internal::CmpHelperLT<double,double>
                    ((internal *)local_160,"std::abs(vals1[i](r, c) - vals2[i](r, c))","1e-10",
                     &local_168,&local_170);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
          if (!bVar1) {
            testing::Message::Message(&local_178);
            pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
            testing::internal::AssertHelper::AssertHelper
                      (&local_180,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_utils.h"
                       ,0x2b,pcVar8);
            testing::internal::AssertHelper::operator=(&local_180,&local_178);
            testing::internal::AssertHelper::~AssertHelper(&local_180);
            testing::Message::~Message(&local_178);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
          gtest_ar_2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._0_4_ =
               (int)gtest_ar_2.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl + 1;
        }
        gtest_ar_2.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ =
             gtest_ar_2.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl._4_4_ + 1;
      }
    }
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ = 0;
LAB_001be970:
    std::
    vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
    ::~vector((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
               *)local_d8);
    std::
    vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
    ::~vector((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
               *)local_b0);
    quad::QuadRule::~QuadRule((QuadRule *)local_90);
    if (gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ != 0) {
      return;
    }
    __gnu_cxx::
    __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
    ::operator++(&__end5);
  } while( true );
}

Assistant:

void checkMeshFunctionEqual(const mesh::Mesh& m, A a, B b, int codim = 0) {
  using scalar_t = MeshFunctionReturnType<A>;
  static_assert(std::is_convertible_v<scalar_t, MeshFunctionReturnType<B>>);

  if constexpr (std::is_arithmetic_v<scalar_t>) {
    for (auto e : m.Entities(codim)) {
      auto ref_el = e->RefEl();
      auto qr = lf::quad::make_QuadRule(ref_el, 5);
      auto vals1 = a(*e, qr.Points());
      auto vals2 = b(*e, qr.Points());
      for (int i = 0; i < vals1.size(); ++i) {
        EXPECT_LT(vals1[i] - vals2[i], 1e-10) << "i=" << i;
      }
    }
  } else if constexpr (std::is_convertible_v<MeshFunctionReturnType<A>,
                                             Eigen::MatrixXd> ||
                       std::is_convertible_v<MeshFunctionReturnType<A>,
                                             Eigen::ArrayXd>) {
    for (auto e : m.Entities(codim)) {
      auto ref_el = e->RefEl();
      auto qr = lf::quad::make_QuadRule(ref_el, 5);
      auto vals1 = a(*e, qr.Points());
      auto vals2 = b(*e, qr.Points());
      for (int i = 0; i < vals1.size(); ++i) {
        ASSERT_EQ(vals1[i].rows(), vals2[i].rows());
        ASSERT_EQ(vals1[i].cols(), vals2[i].cols());
        for (int r = 0; r < vals1[i].rows(); ++r) {
          for (int c = 0; c < vals1[i].cols(); ++c) {
            EXPECT_LT(std::abs(vals1[i](r, c) - vals2[i](r, c)), 1e-10);
          }
        }
      }
    }
  } else {
    for (auto e : m.Entities(codim)) {
      auto ref_el = e->RefEl();
      auto qr = lf::quad::make_QuadRule(ref_el, 5);
      auto vals1 = a(*e, qr.Points());
      auto vals2 = b(*e, qr.Points());
      for (int i = 0; i < vals1.size(); ++i) {
        EXPECT_EQ(vals1[i], vals2[i]) << "i=" << i;
      }
    }
  }
}